

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

int adiak_hostname(void)

{
  int iVar1;
  char hostname [512];
  char acStack_208 [520];
  
  iVar1 = adksys_hostname(acStack_208,0x200);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    iVar1 = adiak_namevalue("hostname",2,"host","%s",acStack_208);
  }
  return iVar1;
}

Assistant:

int adiak_hostname()
{
   int result;
   char hostname[512];

   result = adksys_hostname(hostname, sizeof(hostname));
   if (result == -1)
      return -1;

   return adiak_namevalue("hostname", adiak_general, "host", "%s", hostname);
}